

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O2

StorageType __thiscall
tcu::Float<unsigned_int,_8,_23,_127,_3U>::mantissa(Float<unsigned_int,_8,_23,_127,_3U> *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = this->m_value;
  if ((uVar1 & 0x7fffffff) != 0) {
    uVar2 = uVar1 & 0x7fffff;
    uVar3 = uVar2;
    if (uVar2 == 0) {
      uVar3 = uVar2 + 0x800000;
    }
    if ((uVar1 & 0x7f800000) != 0) {
      uVar3 = uVar2 + 0x800000;
    }
    return uVar3;
  }
  return 0;
}

Assistant:

inline StorageType		exponentBits	(void) const	{ return (m_value >> MantissaBits) & ((StorageType(1)<<ExponentBits)-1);	}